

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

normal3f tinyusdz::transform(matrix4d *m,normal3f *p)

{
  normal3f nVar1;
  normal3f local_50;
  normal3f local_40;
  undefined1 local_34 [8];
  normal3f tx;
  normal3f *p_local;
  matrix4d *m_local;
  
  local_34._0_4_ = (undefined4)m->m[3][0];
  local_34._4_4_ = (undefined4)m->m[3][1];
  tx.x = (float)m->m[3][2];
  tx._4_8_ = p;
  nVar1 = value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::normal3f,double,float,3ul>(m,p);
  local_50.z = nVar1.z;
  local_40.z = local_50.z;
  local_50._0_8_ = nVar1._0_8_;
  local_40.x = local_50.x;
  local_40.y = local_50.y;
  nVar1 = operator+(&local_40,(normal3f *)local_34);
  return nVar1;
}

Assistant:

value::normal3f transform(const value::matrix4d &m, const value::normal3f &p) {
  value::normal3f tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  return value::MultV<value::matrix4d, value::normal3f, double, float, 3>(m, p) + tx;
}